

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stock.cpp
# Opt level: O2

void use_stock_with_constructor(void)

{
  Stock *this;
  Stock w_w;
  Stock qs;
  Stock higher;
  Stock merlin;
  Stock aaj;
  
  std::__cxx11::string::string((string *)&aaj,"Apple",(allocator *)&w_w);
  L10_2::Stock::Stock(&merlin,&aaj.company,0x14,30.0);
  std::__cxx11::string::~string((string *)&aaj);
  L10_2::Stock::show(&merlin);
  L10_2::Stock::buy(&merlin,0x1e,50.0);
  L10_2::Stock::show(&merlin);
  L10_2::Stock::sell(&merlin,1000,12.45);
  L10_2::Stock::show(&merlin);
  L10_2::Stock::buy(&merlin,30000,58.3);
  L10_2::Stock::show(&merlin);
  L10_2::Stock::sell(&merlin,30000,0.125);
  L10_2::Stock::show(&merlin);
  std::__cxx11::string::string((string *)&w_w,"Microsoft",(allocator *)&qs);
  L10_2::Stock::Stock(&aaj,&w_w.company,0x14,30.0);
  std::__cxx11::string::~string((string *)&w_w);
  L10_2::Stock::show(&aaj);
  this = (Stock *)operator_new(0x38);
  std::__cxx11::string::string((string *)&w_w,"Google",(allocator *)&qs);
  L10_2::Stock::Stock(this,&w_w.company,0x1e,50.0);
  std::__cxx11::string::~string((string *)&w_w);
  L10_2::Stock::show(this);
  std::__cxx11::string::string((string *)&qs,"Oracle",(allocator *)&higher);
  L10_2::Stock::Stock(&w_w,&qs.company,300,20.0);
  std::__cxx11::string::~string((string *)&qs);
  L10_2::Stock::show(&w_w);
  std::operator<<((ostream *)&std::cout,"----> re assign to exist stock:\n");
}

Assistant:

void use_stock_with_constructor() {
    using namespace L10_2;

    //  call constructor explicitly
    Stock merlin = Stock("Apple", 20, 30);
//    merlin.acquire("Apple", 20, 30);
    merlin.show();
    merlin.buy(30, 50);
    merlin.show();
    merlin.sell(1000, 12.45);
    merlin.show();
    merlin.buy(30000, 58.3);
    merlin.show();
    merlin.sell(30000, 0.125);
    merlin.show();

    //  call constructor implicitly
    Stock aaj("Microsoft", 20, 30);
    aaj.show();

    //  create with *new*， without a name, but holding it with a pointer
    Stock * p_stock = new Stock("Google", 30, 50);
    p_stock->show();

    Stock w_w("Oracle", 300, 20);
    w_w.show();

    std::cout << "----> re assign to exist stock:\n";
    //  创建临时实例，并复制到目标对象中，再将临时实例丢弃
    w_w = Stock("Facebook");
    w_w.show();
//    merlin = Stock("Oracle", 300, 20);

    const Stock qs("Ali");
    qs.show();

    //  比较并获取引用，不生成新的
    const Stock higher = merlin.compare(aaj);
    higher.show();
}